

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O2

void __thiscall
cbtConvexHullShape::cbtConvexHullShape
          (cbtConvexHullShape *this,cbtScalar *points,int numPoints,int stride)

{
  cbtScalar *pcVar1;
  cbtScalar cVar2;
  cbtVector3 *pcVar3;
  long lVar4;
  cbtScalar *pcVar5;
  cbtVector3 cStack_38;
  
  cbtPolyhedralConvexAabbCachingShape::cbtPolyhedralConvexAabbCachingShape
            (&this->super_cbtPolyhedralConvexAabbCachingShape);
  (this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape
       = (_func_int **)&PTR__cbtConvexHullShape_01196010;
  (this->m_unscaledPoints).m_ownsMemory = true;
  (this->m_unscaledPoints).m_data = (cbtVector3 *)0x0;
  (this->m_unscaledPoints).m_size = 0;
  (this->m_unscaledPoints).m_capacity = 0;
  (this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
  super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 4;
  cbtAlignedObjectArray<cbtVector3>::resize(&this->m_unscaledPoints,numPoints,&cStack_38);
  pcVar5 = points + 2;
  for (lVar4 = 0; (ulong)(uint)(~(numPoints >> 0x1f) & numPoints) << 4 != lVar4;
      lVar4 = lVar4 + 0x10) {
    cVar2 = *pcVar5;
    pcVar1 = pcVar5 + -2;
    pcVar3 = (this->m_unscaledPoints).m_data;
    pcVar5 = (cbtScalar *)((long)pcVar5 + (long)stride);
    *(undefined8 *)((long)pcVar3->m_floats + lVar4) = *(undefined8 *)pcVar1;
    *(cbtScalar *)((long)pcVar3->m_floats + lVar4 + 8) = cVar2;
    *(undefined4 *)((long)pcVar3->m_floats + lVar4 + 0xc) = 0;
  }
  cbtPolyhedralConvexAabbCachingShape::recalcLocalAabb
            (&this->super_cbtPolyhedralConvexAabbCachingShape);
  return;
}

Assistant:

cbtConvexHullShape ::cbtConvexHullShape(const cbtScalar* points, int numPoints, int stride) : cbtPolyhedralConvexAabbCachingShape()
{
	m_shapeType = CONVEX_HULL_SHAPE_PROXYTYPE;
	m_unscaledPoints.resize(numPoints);

	unsigned char* pointsAddress = (unsigned char*)points;

	for (int i = 0; i < numPoints; i++)
	{
		cbtScalar* point = (cbtScalar*)pointsAddress;
		m_unscaledPoints[i] = cbtVector3(point[0], point[1], point[2]);
		pointsAddress += stride;
	}

	recalcLocalAabb();
}